

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O0

SCCResult * __thiscall
StrongConnectedComponents::getAdjacencyList(StrongConnectedComponents *this,int node)

{
  _Bit_iterator __last;
  _Bit_iterator __first;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  StrongConnectedComponents *this_00;
  int in_ESI;
  StrongConnectedComponents *in_RDI;
  iterator iVar4;
  reference rVar5;
  int j;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *adjacencyList;
  vector<int,_std::allocator<int>_> *nodes;
  int i;
  size_type adjListOriginal_s;
  byte local_a9;
  vector<bool,_std::allocator<bool>_> *this_01;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  StrongConnectedComponents *in_stack_ffffffffffffff80;
  SCCResult *sccr;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffe8;
  StrongConnectedComponents *this_02;
  SCCResult *local_8;
  
  this_02 = in_RDI;
  sVar3 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(in_RDI->adjListOriginal);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)this_02,
             CONCAT44(in_ESI,in_stack_ffffffffffffffe8),SUB81(sVar3 >> 0x38,0));
  this_01 = &in_RDI->visited;
  std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x1b274a);
  iVar4 = std::vector<bool,_std::allocator<bool>_>::end(this_01);
  iVar2 = (int)((ulong)this_01 >> 0x20);
  this_00 = (StrongConnectedComponents *)iVar4.super__Bit_iterator_base._M_p;
  in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c & 0xffffff;
  __first.super__Bit_iterator_base._M_p._4_4_ = in_stack_ffffffffffffff7c;
  __first.super__Bit_iterator_base._M_p._0_4_ = in_stack_ffffffffffffff78;
  __first.super__Bit_iterator_base._8_8_ = in_stack_ffffffffffffff80;
  __last.super__Bit_iterator_base._M_p._4_4_ = in_stack_ffffffffffffff6c;
  __last.super__Bit_iterator_base._M_p._0_4_ = in_stack_ffffffffffffff68;
  __last.super__Bit_iterator_base._8_8_ = in_stack_ffffffffffffff70;
  std::fill<std::_Bit_iterator,bool>(__first,__last,(bool *)in_RDI);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1b27cb);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x1b27dc);
  makeAdjListSubgraph(in_RDI,iVar2);
  iVar2 = in_ESI;
  do {
    if (sVar3 <= (ulong)(long)in_ESI) {
      local_8 = &sccr_dummy;
      return local_8;
    }
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_ffffffffffffff70,
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    sccr = (SCCResult *)rVar5._M_mask;
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      getStrongConnectedComponents(this_02,iVar2);
      in_stack_ffffffffffffff80 =
           (StrongConnectedComponents *)getLowestIdComponent(in_stack_ffffffffffffff80);
      local_a9 = 0;
      if (in_stack_ffffffffffffff80 != (StrongConnectedComponents *)0x0) {
        bVar1 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)in_RDI);
        local_a9 = 0;
        if (!bVar1) {
          bVar1 = find_vec<int>((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                                (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                               );
          local_a9 = 0;
          if (!bVar1) {
            bVar1 = find_vec<int>((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                                  (int *)CONCAT44(in_stack_ffffffffffffff6c,
                                                  in_stack_ffffffffffffff68));
            local_a9 = bVar1 ^ 0xff;
          }
        }
      }
      if ((local_a9 & 1) == 0) {
        if (in_stack_ffffffffffffff80 != (StrongConnectedComponents *)0x0) {
          buildAdjList(this_00,(vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_ESI),sccr);
          in_stack_ffffffffffffff70 =
               (vector<bool,_std::allocator<bool>_> *)
               SCCResult::getAdjListForWrite(&in_RDI->sccr_current);
          bVar1 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::empty((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)in_RDI);
          if (!bVar1) {
            for (in_stack_ffffffffffffff6c = 0; (ulong)(long)in_stack_ffffffffffffff6c < sVar3;
                in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c + 1) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)in_stack_ffffffffffffff70,(long)in_stack_ffffffffffffff6c);
              bVar1 = std::vector<int,_std::allocator<int>_>::empty
                                ((vector<int,_std::allocator<int>_> *)in_RDI);
              if (!bVar1) {
                SCCResult::setLowestNodeId(&in_RDI->sccr_current,in_stack_ffffffffffffff6c);
                return &in_RDI->sccr_current;
              }
            }
          }
        }
      }
      else {
        iVar2 = iVar2 + 1;
      }
    }
    in_ESI = in_ESI + 1;
  } while( true );
}

Assistant:

SCCResult& StrongConnectedComponents::getAdjacencyList(int node) {
    auto adjListOriginal_s = adjListOriginal.size();
    lowlink.resize(adjListOriginal_s);
    number.resize(adjListOriginal_s);
    visited.resize(adjListOriginal_s);

    while (true) {
        std::fill(visited.begin(), visited.end(), false);
        stack.clear();
        currentSCCs.clear();

        makeAdjListSubgraph(node);
        for (int i = node; i < adjListOriginal_s; i++) {
            if (!visited[i]) {
                getStrongConnectedComponents(i);
                const std::vector<int>* nodes = getLowestIdComponent();
                if (nodes != nullptr && !nodes->empty() && !find_vec(*nodes, node) &&
                    !find_vec(*nodes, node + 1)) {
                    node++;
                    continue;
                }
                else if (nodes != nullptr) {
                    buildAdjList(*nodes, sccr_current);
                    auto& adjacencyList = sccr_current.getAdjListForWrite();
                    if (!adjacencyList.empty()) {
                        for (int j = 0; j < adjListOriginal_s; j++) {
                            if (!adjacencyList[j].empty()) {
                                sccr_current.setLowestNodeId(j);
                                return sccr_current;
                            }
                        }
                    }
                }
            }
        }
        return sccr_dummy;
    }
}